

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar11 [64];
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_max op;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  int local_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  int local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  int local_7c0;
  undefined8 *local_7b0;
  uint *local_7a8;
  undefined1 (*local_7a0) [64];
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  
  local_7b0 = in_RDX;
  local_7a8 = in_RSI;
  local_7a0 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_7c0 = 0; local_7c0 < in_ECX; local_7c0 = local_7c0 + 1) {
      auVar11 = vbroadcastss_avx512f(ZEXT416(*local_7a8));
      auVar11 = vmaxps_avx512f(*local_7a0,auVar11);
      local_880 = auVar11._0_8_;
      uStack_878 = auVar11._8_8_;
      uStack_870 = auVar11._16_8_;
      uStack_868 = auVar11._24_8_;
      uStack_860 = auVar11._32_8_;
      uStack_858 = auVar11._40_8_;
      uStack_850 = auVar11._48_8_;
      uStack_848 = auVar11._56_8_;
      *local_7b0 = local_880;
      local_7b0[1] = uStack_878;
      local_7b0[2] = uStack_870;
      local_7b0[3] = uStack_868;
      local_7b0[4] = uStack_860;
      local_7b0[5] = uStack_858;
      local_7b0[6] = uStack_850;
      local_7b0[7] = uStack_848;
      local_7a0 = local_7a0 + 1;
      local_7a8 = local_7a8 + 1;
      local_7b0 = local_7b0 + 8;
    }
  }
  if (in_R8D == 8) {
    for (local_884 = 0; local_884 + 1 < in_ECX; local_884 = local_884 + 2) {
      uVar1 = *local_7a8;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_3d0 = auVar5._0_8_;
      uStack_3c8 = auVar5._8_8_;
      uVar1 = local_7a8[1];
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uStack_390 = auVar6._0_8_;
      uStack_388 = auVar6._8_8_;
      auVar7._16_8_ = uStack_390;
      auVar7._0_16_ = auVar5;
      auVar7._24_8_ = uStack_388;
      auVar11 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_3c8,CONCAT816(uStack_3d0,auVar4))),auVar7,1);
      auVar11 = vmaxps_avx512f(*local_7a0,auVar11);
      local_9c0 = auVar11._0_8_;
      uStack_9b8 = auVar11._8_8_;
      uStack_9b0 = auVar11._16_8_;
      uStack_9a8 = auVar11._24_8_;
      uStack_9a0 = auVar11._32_8_;
      uStack_998 = auVar11._40_8_;
      uStack_990 = auVar11._48_8_;
      uStack_988 = auVar11._56_8_;
      *local_7b0 = local_9c0;
      local_7b0[1] = uStack_9b8;
      local_7b0[2] = uStack_9b0;
      local_7b0[3] = uStack_9a8;
      local_7b0[4] = uStack_9a0;
      local_7b0[5] = uStack_998;
      local_7b0[6] = uStack_990;
      local_7b0[7] = uStack_988;
      local_7a0 = local_7a0 + 1;
      local_7a8 = local_7a8 + 2;
      local_7b0 = local_7b0 + 8;
    }
    for (; local_884 < in_ECX; local_884 = local_884 + 1) {
      uVar1 = *local_7a8;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_350 = auVar4._0_8_;
      uStack_348 = auVar4._8_8_;
      auVar10._16_8_ = uStack_350;
      auVar10._0_16_ = auVar5;
      auVar10._24_8_ = uStack_348;
      auVar7 = vmaxps_avx(*(undefined1 (*) [32])*local_7a0,auVar10);
      local_a20 = auVar7._0_8_;
      uStack_a18 = auVar7._8_8_;
      uStack_a10 = auVar7._16_8_;
      uStack_a08 = auVar7._24_8_;
      *local_7b0 = local_a20;
      local_7b0[1] = uStack_a18;
      local_7b0[2] = uStack_a10;
      local_7b0[3] = uStack_a08;
      local_7a0 = (undefined1 (*) [64])(*local_7a0 + 0x20);
      local_7a8 = local_7a8 + 1;
      local_7b0 = local_7b0 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_a24 = 0; local_a24 + 3 < in_ECX; local_a24 = local_a24 + 4) {
      uVar1 = *local_7a8;
      uVar2 = local_7a8[1];
      uVar3 = local_7a8[2];
      auVar8._4_4_ = uVar3;
      auVar8._0_4_ = uVar3;
      auVar8._12_4_ = uVar3;
      auVar8._8_4_ = uVar3;
      uVar3 = local_7a8[3];
      auVar8._20_4_ = uVar3;
      auVar8._16_4_ = uVar3;
      auVar8._28_4_ = uVar3;
      auVar8._24_4_ = uVar3;
      auVar11 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(CONCAT44(uVar2,uVar2),
                                              CONCAT816(CONCAT44(uVar2,uVar2),
                                                        CONCAT88(CONCAT44(uVar1,uVar1),
                                                                 CONCAT44(uVar1,uVar1))))),auVar8,1)
      ;
      auVar11 = vmaxps_avx512f(*local_7a0,auVar11);
      local_b80 = auVar11._0_8_;
      uStack_b78 = auVar11._8_8_;
      uStack_b70 = auVar11._16_8_;
      uStack_b68 = auVar11._24_8_;
      uStack_b60 = auVar11._32_8_;
      uStack_b58 = auVar11._40_8_;
      uStack_b50 = auVar11._48_8_;
      uStack_b48 = auVar11._56_8_;
      *local_7b0 = local_b80;
      local_7b0[1] = uStack_b78;
      local_7b0[2] = uStack_b70;
      local_7b0[3] = uStack_b68;
      local_7b0[4] = uStack_b60;
      local_7b0[5] = uStack_b58;
      local_7b0[6] = uStack_b50;
      local_7b0[7] = uStack_b48;
      local_7a0 = local_7a0 + 1;
      local_7a8 = local_7a8 + 4;
      local_7b0 = local_7b0 + 8;
    }
    for (; local_a24 + 1 < in_ECX; local_a24 = local_a24 + 2) {
      uVar1 = *local_7a8;
      auVar9._4_4_ = uVar1;
      auVar9._0_4_ = uVar1;
      auVar9._12_4_ = uVar1;
      auVar9._8_4_ = uVar1;
      uVar1 = local_7a8[1];
      auVar9._20_4_ = uVar1;
      auVar9._16_4_ = uVar1;
      auVar9._28_4_ = uVar1;
      auVar9._24_4_ = uVar1;
      auVar7 = vmaxps_avx(*(undefined1 (*) [32])*local_7a0,auVar9);
      local_c00 = auVar7._0_8_;
      uStack_bf8 = auVar7._8_8_;
      uStack_bf0 = auVar7._16_8_;
      uStack_be8 = auVar7._24_8_;
      *local_7b0 = local_c00;
      local_7b0[1] = uStack_bf8;
      local_7b0[2] = uStack_bf0;
      local_7b0[3] = uStack_be8;
      local_7a0 = (undefined1 (*) [64])(*local_7a0 + 0x20);
      local_7a8 = local_7a8 + 2;
      local_7b0 = local_7b0 + 4;
    }
    for (; local_a24 < in_ECX; local_a24 = local_a24 + 1) {
      uVar1 = *local_7a8;
      auVar4._4_4_ = uVar1;
      auVar4._0_4_ = uVar1;
      auVar4._12_4_ = uVar1;
      auVar4._8_4_ = uVar1;
      auVar4 = vmaxps_avx(*(undefined1 (*) [16])*local_7a0,auVar4);
      local_c30 = auVar4._0_8_;
      uStack_c28 = auVar4._8_8_;
      *local_7b0 = local_c30;
      local_7b0[1] = uStack_c28;
      local_7a0 = (undefined1 (*) [64])(*local_7a0 + 0x10);
      local_7a8 = local_7a8 + 1;
      local_7b0 = local_7b0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}